

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extension_set.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::ExtensionSet::AddEnum
          (ExtensionSet *this,int number,FieldType type,bool packed,int value,
          FieldDescriptor *descriptor)

{
  bool bVar1;
  CppType CVar2;
  RepeatedField<int> *this_00;
  LogMessage *pLVar3;
  LogFinisher local_13a;
  byte local_139;
  LogMessage local_138;
  LogFinisher local_fa;
  byte local_f9;
  LogMessage local_f8;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  LogFinisher local_7d [20];
  byte local_69;
  LogMessage local_68;
  Extension *local_30;
  Extension *extension;
  FieldDescriptor *descriptor_local;
  byte local_16;
  FieldType local_15;
  int value_local;
  bool packed_local;
  FieldType type_local;
  ExtensionSet *pEStack_10;
  int number_local;
  ExtensionSet *this_local;
  
  extension = (Extension *)descriptor;
  descriptor_local._4_4_ = value;
  local_16 = packed;
  local_15 = type;
  value_local = number;
  pEStack_10 = this;
  bVar1 = MaybeNewExtension(this,number,descriptor,&local_30);
  if (bVar1) {
    local_30->type = local_15;
    CVar2 = anon_unknown_0::cpp_type(local_30->type);
    local_69 = 0;
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_68,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x16b);
      local_69 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_68,
                          "CHECK failed: (cpp_type(extension->type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(local_7d,pLVar3);
    }
    if ((local_69 & 1) != 0) {
      LogMessage::~LogMessage(&local_68);
    }
    local_30->is_repeated = true;
    local_30->is_packed = (bool)(local_16 & 1);
    this_00 = (RepeatedField<int> *)operator_new(0x10);
    RepeatedField<int>::RepeatedField(this_00);
    (local_30->field_0).repeated_int32_value = this_00;
  }
  else {
    local_b9 = 0;
    if ((local_30->is_repeated & 1U) == 0) {
      LogMessage::LogMessage
                (&local_b8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x170);
      local_b9 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_b8,
                          "CHECK failed: ((*extension).is_repeated ? REPEATED : OPTIONAL) == (REPEATED): "
                         );
      LogFinisher::operator=(&local_ba,pLVar3);
    }
    if ((local_b9 & 1) != 0) {
      LogMessage::~LogMessage(&local_b8);
    }
    CVar2 = anon_unknown_0::cpp_type(local_30->type);
    local_f9 = 0;
    if (CVar2 != CPPTYPE_ENUM) {
      LogMessage::LogMessage
                (&local_f8,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x170);
      local_f9 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_f8,
                          "CHECK failed: (cpp_type((*extension).type)) == (WireFormatLite::CPPTYPE_ENUM): "
                         );
      LogFinisher::operator=(&local_fa,pLVar3);
    }
    if ((local_f9 & 1) != 0) {
      LogMessage::~LogMessage(&local_f8);
    }
    local_139 = 0;
    if ((local_30->is_packed & 1U) != (local_16 & 1)) {
      LogMessage::LogMessage
                (&local_138,LOGLEVEL_DFATAL,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/extension_set.cc"
                 ,0x171);
      local_139 = 1;
      pLVar3 = LogMessage::operator<<
                         (&local_138,"CHECK failed: (extension->is_packed) == (packed): ");
      LogFinisher::operator=(&local_13a,pLVar3);
    }
    if ((local_139 & 1) != 0) {
      LogMessage::~LogMessage(&local_138);
    }
  }
  RepeatedField<int>::Add
            ((local_30->field_0).repeated_int32_value,(int *)((long)&descriptor_local + 4));
  return;
}

Assistant:

void ExtensionSet::AddEnum(int number, FieldType type,
                           bool packed, int value,
                           const FieldDescriptor* descriptor) {
  Extension* extension;
  if (MaybeNewExtension(number, descriptor, &extension)) {
    extension->type = type;
    GOOGLE_DCHECK_EQ(cpp_type(extension->type), WireFormatLite::CPPTYPE_ENUM);
    extension->is_repeated = true;
    extension->is_packed = packed;
    extension->repeated_enum_value = new RepeatedField<int>();
  } else {
    GOOGLE_DCHECK_TYPE(*extension, REPEATED, ENUM);
    GOOGLE_DCHECK_EQ(extension->is_packed, packed);
  }
  extension->repeated_enum_value->Add(value);
}